

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

void __thiscall CMU462::HalfedgeMesh::computeLinearSubdivisionPositions(HalfedgeMesh *this)

{
  undefined8 uVar1;
  _List_node_base *p_Var2;
  _List_node_base *local_38;
  _List_node_base *p_Stack_30;
  _List_node_base *local_28;
  
  p_Var2 = (_List_node_base *)&this->vertices;
  while (p_Var2 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var2->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->vertices) {
    p_Var2[5]._M_prev = p_Var2[2]._M_prev;
    uVar1 = p_Var2[2]._M_next;
    p_Var2[4]._M_prev = p_Var2[1]._M_prev;
    p_Var2[5]._M_next = (_List_node_base *)uVar1;
  }
  p_Var2 = (_List_node_base *)&this->edges;
  while (p_Var2 = (((_List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->edges) {
    (**(code **)p_Var2[1]._M_next)(&local_38,p_Var2 + 1);
    p_Var2[2]._M_prev = local_28;
    p_Var2[1]._M_prev = local_38;
    p_Var2[2]._M_next = p_Stack_30;
  }
  p_Var2 = (_List_node_base *)&this->faces;
  while (p_Var2 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->faces) {
    (**(code **)p_Var2[1]._M_next)(&local_38,p_Var2 + 1);
    p_Var2[3]._M_next = local_28;
    p_Var2[2]._M_next = local_38;
    p_Var2[2]._M_prev = p_Stack_30;
  }
  return;
}

Assistant:

void HalfedgeMesh::computeLinearSubdivisionPositions() {
	// TODO For each vertex, assign Vertex::newPosition to
	// its original position, Vertex::position.
	for (VertexIter x = verticesBegin(); x != verticesEnd(); x++) {
		x->newPosition = x->position;
	}

	// TODO For each edge, assign the midpoint of the two original
	// positions to Edge::newPosition.
	for (EdgeIter x = edgesBegin(); x != edgesEnd(); x++) {
		x->newPosition = x->centroid();
	}

	// TODO For each face, assign the centroid (i.e., arithmetic mean)
	// of the original vertex positions to Face::newPosition.  Note
	// that in general, NOT all faces will be triangles!
	for (FaceIter x = facesBegin(); x != facesEnd(); x++) {
		x->newPosition = x->centroid();
	}

	//showError("computeLinearSubdivisionPositions() not implemented.");
}